

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::Shape::Init(Shape *this,S2Polygon *polygon)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  S2Loop *this_00;
  int local_24;
  int i;
  int num_loops;
  int kMaxLinearSearchLoops;
  S2Polygon *polygon_local;
  Shape *this_local;
  
  this->polygon_ = polygon;
  if (this->cumulative_edges_ != (int *)0x0) {
    operator_delete__(this->cumulative_edges_);
  }
  this->cumulative_edges_ = (int *)0x0;
  *(undefined4 *)&(this->super_S2Shape).field_0xc = 0;
  bVar2 = is_full(polygon);
  if (!bVar2) {
    iVar3 = S2Polygon::num_loops(polygon);
    if (0xc < iVar3) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)iVar3;
      uVar5 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar5 = 0xffffffffffffffff;
      }
      piVar6 = (int *)operator_new__(uVar5);
      this->cumulative_edges_ = piVar6;
    }
    for (local_24 = 0; local_24 < iVar3; local_24 = local_24 + 1) {
      if (this->cumulative_edges_ != (int *)0x0) {
        this->cumulative_edges_[local_24] = *(int *)&(this->super_S2Shape).field_0xc;
      }
      this_00 = S2Polygon::loop(polygon,local_24);
      iVar4 = S2Loop::num_vertices(this_00);
      *(int *)&(this->super_S2Shape).field_0xc = iVar4 + *(int *)&(this->super_S2Shape).field_0xc;
    }
  }
  return;
}

Assistant:

void S2Polygon::Shape::Init(const S2Polygon* polygon) {
  polygon_ = polygon;
  delete[] cumulative_edges_;
  cumulative_edges_ = nullptr;
  num_edges_ = 0;
  if (!polygon->is_full()) {
    const int kMaxLinearSearchLoops = 12;  // From benchmarks.
    int num_loops = polygon->num_loops();
    if (num_loops > kMaxLinearSearchLoops) {
      cumulative_edges_ = new int[num_loops];
    }
    for (int i = 0; i < num_loops; ++i) {
      if (cumulative_edges_) cumulative_edges_[i] = num_edges_;
      num_edges_ += polygon->loop(i)->num_vertices();
    }
  }
}